

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O1

ECDSA_SIG * unpack_cp_signature(uchar *sigbuf,size_t siglen)

{
  ECDSA_SIG *pEVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  int len;
  
  pEVar1 = ECDSA_SIG_new();
  if (pEVar1 == (ECDSA_SIG *)0x0) {
    ERR_GOST_error(0x88,0xc0100,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                   ,0x20f);
    pEVar1 = (ECDSA_SIG *)0x0;
  }
  else {
    len = (int)(siglen >> 1);
    pBVar2 = BN_bin2bn(sigbuf,len,(BIGNUM *)0x0);
    pBVar3 = BN_bin2bn(sigbuf + (siglen >> 1),len,(BIGNUM *)0x0);
    ECDSA_SIG_set0(pEVar1,pBVar3,pBVar2);
  }
  return (ECDSA_SIG *)pEVar1;
}

Assistant:

ECDSA_SIG *unpack_cp_signature(const unsigned char *sigbuf, size_t siglen)
{
    ECDSA_SIG *sig;
    BIGNUM *r = NULL, *s = NULL;

    sig = ECDSA_SIG_new();
    if (sig == NULL) {
        GOSTerr(GOST_F_UNPACK_CP_SIGNATURE, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    s = BN_bin2bn(sigbuf, siglen / 2, NULL);
    r = BN_bin2bn(sigbuf + siglen / 2, siglen / 2, NULL);
    ECDSA_SIG_set0(sig, r, s);
    return sig;
}